

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPool.c
# Opt level: O0

void sbfPool_showSummary(sbfLog log,sbfLogLevel level)

{
  uint in_ESI;
  sbfLog in_RDI;
  char tmp [64];
  sbfPoolCount count;
  undefined4 uVar2;
  undefined8 uVar1;
  undefined4 uVar4;
  undefined8 uVar3;
  char local_58 [64];
  sbfPoolCountImpl *local_18;
  uint local_c;
  sbfLog local_8;
  
  uVar1 = 0;
  uVar3 = 0;
  local_c = in_ESI;
  local_8 = in_RDI;
  sbfLog_log(in_RDI,(sbfLogLevel)(ulong)in_ESI,"%-30s %6s%6s%11s%11s",
             "Pool -------------------------","Pools","Size","Get","New");
  pthread_mutex_lock((pthread_mutex_t *)&gSbfPoolCountMutex);
  for (local_18 = sbfPoolCountTreeImpl_RB_MINMAX(&gSbfPoolCountTree,-1);
      uVar4 = (undefined4)((ulong)uVar3 >> 0x20), uVar2 = (undefined4)((ulong)uVar1 >> 0x20),
      local_18 != (sbfPoolCountImpl *)0x0; local_18 = sbfPoolCountTreeImpl_RB_NEXT(local_18)) {
    if (local_18->mGets != 0) {
      snprintf(local_58,0x40,"%s:%u",local_18->mFunction,(ulong)local_18->mLine);
      uVar1 = CONCAT44(uVar2,local_18->mGets);
      uVar3 = CONCAT44(uVar4,local_18->mNews);
      sbfLog_log(local_8,(sbfLogLevel)(ulong)local_c,"%-30.30s %6u%6zu%11u%11u",local_58,
                 (ulong)local_18->mPools,local_18->mSize,uVar1,uVar3);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&gSbfPoolCountMutex);
  return;
}

Assistant:

void
sbfPool_showSummary (sbfLog log, sbfLogLevel level)
{
    sbfPoolCount count;
    char         tmp[64];

    sbfLog_log (log,
                level,
                "%-30s %6s%6s%11s%11s",
                "Pool -------------------------",
                "Pools",
                "Size",
                "Get",
                "New");
    sbfMutex_lock (&gSbfPoolCountMutex);
    RB_FOREACH (count, sbfPoolCountTreeImpl, &gSbfPoolCountTree)
    {
        if (count->mGets != 0)
        {
            snprintf (tmp,
                      sizeof tmp,
                      "%s:%u",
                      count->mFunction,
                      count->mLine);

            sbfLog_log (log,
                        level,
                        "%-30.30s %6u%6zu%11u%11u",
                        tmp,
                        count->mPools,
                        count->mSize,
                        count->mGets,
                        count->mNews);
        }
    }
    sbfMutex_unlock (&gSbfPoolCountMutex);
}